

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::descriptor_unittest::
DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody
          (DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test *this)

{
  pointer ptVar1;
  pointer ptVar2;
  size_type sVar3;
  ulong uVar4;
  Reflection *pRVar5;
  Reflection *pRVar6;
  Reflection *extraout_RDX;
  Reflection *extraout_RDX_00;
  thread *thread;
  ulong uVar7;
  Reflection *pRVar8;
  vector<std::thread,_std::allocator<std::thread>_> *__range2;
  int iVar9;
  Metadata MVar10;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  TestAllTypes message;
  vector<std::thread,_std::allocator<std::thread>_> local_3c8;
  size_type local_3a8;
  Descriptor *local_3a0;
  id local_398;
  thread local_390 [2];
  Descriptor *local_380;
  int local_378;
  TestAllTypes local_370;
  
  local_398._M_thread = (native_handle_type)this;
  proto2_unittest::TestAllTypes::TestAllTypes(&local_370,(Arena *)0x0);
  MVar10 = proto2_unittest::TestAllTypes::GetMetadata
                     ((TestAllTypes *)&proto2_unittest::_TestAllTypes_default_instance_);
  local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pRVar8 = (Reflection *)
           local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_start;
  pRVar5 = (Reflection *)
           local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (0 < (MVar10.descriptor)->field_count_) {
    iVar9 = 0;
    local_3a0 = MVar10.descriptor;
    do {
      ptVar2 = local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
      ptVar1 = local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_380 = MVar10.descriptor;
      local_390[0]._M_id._M_thread = (id)(id)local_398._M_thread;
      local_378 = iVar9;
      if (local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        if ((long)local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                  super__Vector_impl_data._M_start == 0x7ffffffffffffff8) {
          std::__throw_length_error("vector::_M_realloc_insert");
        }
        uVar7 = (long)local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3;
        uVar4 = uVar7 + (uVar7 == 0);
        local_3a8 = uVar4 + uVar7;
        if (0xffffffffffffffe < local_3a8) {
          local_3a8 = 0xfffffffffffffff;
        }
        if (CARRY8(uVar4,uVar7)) {
          local_3a8 = 0xfffffffffffffff;
        }
        if (local_3a8 == 0) {
          pRVar5 = (Reflection *)0x0;
        }
        else {
          pRVar5 = (Reflection *)
                   __gnu_cxx::new_allocator<std::thread>::allocate
                             ((new_allocator<std::thread> *)&local_3c8,local_3a8,(void *)0x0);
          MVar10.reflection = extraout_RDX_00;
          MVar10.descriptor = local_380;
        }
        local_380 = MVar10.descriptor;
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__1>
                  ((allocator_type *)((id *)&pRVar5->descriptor_ + uVar7),local_390,
                   (anon_class_32_4_a47d18ca_for__M_head_impl *)MVar10.reflection);
        sVar3 = local_3a8;
        pRVar8 = pRVar5;
        for (pRVar6 = (Reflection *)ptVar1; pRVar6 != (Reflection *)ptVar2;
            pRVar6 = (Reflection *)&pRVar6->schema_) {
          ((id *)&pRVar8->descriptor_)->_M_thread = 0;
          ((id *)&pRVar8->descriptor_)->_M_thread = ((id *)&pRVar6->descriptor_)->_M_thread;
          ((id *)&pRVar6->descriptor_)->_M_thread = 0;
          pRVar8 = (Reflection *)&pRVar8->schema_;
        }
        if ((Reflection *)ptVar1 != (Reflection *)0x0) {
          operator_delete(ptVar1,(long)local_3c8.
                                       super__Vector_base<std::thread,_std::allocator<std::thread>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)ptVar1);
        }
        local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)((id *)&pRVar5->descriptor_ + sVar3);
        local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)pRVar5;
      }
      else {
        std::allocator_traits<std::allocator<std::thread>>::
        construct<std::thread,google::protobuf::descriptor_unittest::DescriptorPoolMemoizationTest_MemoizeProjectionMultithreaded_Test::TestBody()::__1>
                  ((allocator_type *)
                   local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                   super__Vector_impl_data._M_finish,local_390,
                   (anon_class_32_4_a47d18ca_for__M_head_impl *)MVar10.reflection);
        pRVar5 = extraout_RDX;
        pRVar8 = (Reflection *)
                 local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      }
      local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)&pRVar8->schema_;
      iVar9 = iVar9 + 1;
      MVar10.reflection = pRVar5;
      MVar10.descriptor = local_3a0;
      pRVar8 = (Reflection *)
               local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_start;
      pRVar5 = (Reflection *)
               local_3c8.super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl.
               super__Vector_impl_data._M_finish;
    } while (iVar9 < local_3a0->field_count_);
  }
  for (; pRVar8 != pRVar5; pRVar8 = (Reflection *)&pRVar8->schema_) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector(&local_3c8);
  proto2_unittest::TestAllTypes::~TestAllTypes(&local_370);
  return;
}

Assistant:

TEST_F(DescriptorPoolMemoizationTest, MemoizeProjectionMultithreaded) {
  auto name_lambda = [](const FieldDescriptor* field) {
    return field->full_name();
  };
  proto2_unittest::TestAllTypes message;
  const Descriptor* descriptor = message.GetDescriptor();
  std::vector<std::thread> threads;
  for (int i = 0; i < descriptor->field_count(); ++i) {
    threads.emplace_back([this, name_lambda, descriptor, i]() {
      auto name = DescriptorPoolMemoizationTest::MemoizeProjection(
          descriptor->field(i), name_lambda);
      auto first_name = DescriptorPoolMemoizationTest::MemoizeProjection(
          descriptor->field(0), name_lambda);
      ASSERT_THAT(name, HasSubstr("proto2_unittest.TestAllTypes"));
      if (i != 0) {
        ASSERT_NE(name, "proto2_unittest.TestAllTypes.optional_int32");
      }
      ASSERT_EQ(first_name, "proto2_unittest.TestAllTypes.optional_int32");
    });
  }
  for (auto& thread : threads) {
    thread.join();
  }
}